

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

char __thiscall anon_unknown.dwarf_c44a87::NumericTokenizer::nextToken(NumericTokenizer *this)

{
  QStringView *pQVar1;
  storage_type_conflict sVar2;
  storage_type_conflict sVar3;
  NumberMode NVar4;
  char32_t cVar5;
  long lVar6;
  storage_type_conflict *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  ushort uVar12;
  uint uVar13;
  qsizetype qVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint unaff_R14D;
  QStringView needle;
  QStringView rhs;
  QStringView rhs_00;
  QStringView needle_00;
  QStringView needle_01;
  QStringView haystack;
  QStringView haystack_00;
  QStringView haystack_01;
  QStringView haystack0;
  QStringView haystack_02;
  QStringView haystack_03;
  QStringView lhs;
  QStringView lhs_00;
  QStringView haystack_04;
  QStringView haystack_05;
  
  lVar6 = this->m_index;
  psVar7 = (this->m_text).m_data;
  sVar2 = psVar7[lVar6];
  if (sVar2 == L'−') {
    this->m_index = lVar6 + 1;
    return '-';
  }
  uVar13 = (uint)(ushort)sVar2;
  uVar16 = (uint)(ushort)sVar2;
  if ((this->m_guide).isC == true) {
    this->m_index = lVar6 + 1;
    if (uVar13 < 0x100) {
      uVar13 = uVar16 | 0x20;
      if ((ushort)sVar2 < 0x41) {
        uVar13 = uVar16;
      }
      cVar15 = (char)uVar13;
      if (uVar13 - 0x30 < 10) {
        return cVar15;
      }
      if ((0x2a < uVar13) && ((int)uVar13 <= (int)this->lastMark)) {
        return cVar15;
      }
      if (((this->m_mode != IntegerMode) && (uVar13 - 0x61 < 0x20)) &&
         ((1 << ((byte)(uVar13 - 0x61) & 0x1f) & 0x2121U) != 0)) {
        return cVar15;
      }
      if (uVar13 == 0x65 && this->m_mode == DoubleScientificMode) {
        return cVar15;
      }
    }
    goto LAB_00318c9a;
  }
  lVar8 = (this->m_text).m_size;
  if ((ushort)sVar2 < 0x100) {
    unaff_R14D = uVar16 | 0x20;
    if ((ushort)sVar2 < 0x41) {
      unaff_R14D = uVar16;
    }
    cVar15 = (char)unaff_R14D;
    if (((((int)cVar15 - 0x30U < 10) || (cVar15 == '+')) || ((unaff_R14D & 0xff) == 0x2d)) ||
       (((this->m_mode != IntegerMode && (unaff_R14D - 0x61 < 0x20)) &&
        ((1 << ((byte)(unaff_R14D - 0x61) & 0x1f) & 0x2121U) != 0)))) {
      this->m_index = lVar6 + 1;
      return cVar15;
    }
  }
  cVar15 = (char)unaff_R14D;
  psVar7 = psVar7 + lVar6;
  lVar18 = lVar8 - lVar6;
  pQVar1 = &(this->m_guide).minus;
  lVar9 = pQVar1->m_size;
  haystack.m_data = psVar7;
  haystack.m_size = lVar18;
  bVar11 = QtPrivate::startsWith(haystack,*pQVar1,CaseSensitive);
  if (bVar11) {
    this->m_index = lVar9 + lVar6;
    return '-';
  }
  pQVar1 = &(this->m_guide).plus;
  lVar9 = pQVar1->m_size;
  haystack_00.m_data = psVar7;
  haystack_00.m_size = lVar18;
  bVar11 = QtPrivate::startsWith(haystack_00,*pQVar1,CaseSensitive);
  if (bVar11) {
    this->m_index = lVar9 + lVar6;
    return '+';
  }
  lVar9 = (this->m_guide).group.m_size;
  if ((lVar9 != 0) &&
     (needle.m_data = (this->m_guide).group.m_data, needle.m_size = lVar9,
     haystack_01.m_data = psVar7, haystack_01.m_size = lVar18,
     bVar11 = QtPrivate::startsWith(haystack_01,needle,CaseSensitive), bVar11)) {
    this->m_index = lVar6 + lVar9;
    bVar11 = fractionGroupClash(this);
    if (!bVar11) {
      return ',';
    }
    haystack0.m_data = psVar7;
    haystack0.m_size = lVar18;
    qVar14 = QtPrivate::findString(haystack0,lVar9,(this->m_guide).decimal,CaseSensitive);
    if (qVar14 != -1) {
      return ',';
    }
    return '.';
  }
  NVar4 = this->m_mode;
  if (NVar4 == IntegerMode) {
LAB_00318e8f:
    if ((this->m_guide).zeroLen == '\x01') {
      if ((uVar16 & 0xf800) == 0xd800) {
        if ((lVar18 < 2 || (uVar13 & 0xdc00) != 0xd800) || ((psVar7[1] & 0xfc00U) != 0xdc00))
        goto LAB_00318fa5;
      }
      else {
        cVar5 = (this->m_guide).zeroUcs;
        if (cVar5 == L'〇') {
          if (uVar16 == 0x3020) {
            uVar13 = 0xffffffff;
          }
          else {
            if (uVar13 == 0x3007) goto LAB_00318f81;
            uVar13 = (ushort)sVar2 - 0x3020;
          }
        }
        else {
LAB_00318f81:
          uVar13 = uVar13 - cVar5;
        }
        if (uVar13 < 10) {
          this->m_index = lVar6 + 1;
          return (byte)uVar13 | 0x30;
        }
LAB_00318fa5:
        if ((lVar9 == 1) &&
           ((((rhs.m_data = L"\xa0", rhs.m_size = 1, lhs.m_data = (this->m_guide).group.m_data,
              lhs.m_size = 1, bVar11 = QtPrivate::equalStrings(lhs,rhs), bVar11 ||
              (rhs_00.m_data = L"\x202f", rhs_00.m_size = 1,
              lhs_00.m_data = (this->m_guide).group.m_data, lhs_00.m_size = 1,
              bVar11 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar11)) && (lVar8 != lVar6)) &&
            (sVar2 == L' ')))) {
          this->m_index = this->m_index + 1;
          return ',';
        }
        if ((this->m_guide).exponentCyrillic == true) {
          needle_00.m_data = L"Е";
          needle_00.m_size = 1;
          haystack_04.m_data = psVar7;
          haystack_04.m_size = lVar18;
          bVar11 = QtPrivate::startsWith(haystack_04,needle_00,CaseInsensitive);
          if ((!bVar11) &&
             (needle_01.m_data = L"E", needle_01.m_size = 1, haystack_05.m_data = psVar7,
             haystack_05.m_size = lVar18,
             bVar11 = QtPrivate::startsWith(haystack_05,needle_01,CaseInsensitive), !bVar11)) {
            return '\0';
          }
          this->m_index = this->m_index + 1;
          goto LAB_0031906a;
        }
      }
    }
    else {
      if ((uVar16 & 0xfc00) != 0xd800) goto LAB_00318fa5;
      if (1 < lVar18) {
        sVar3 = psVar7[1];
        uVar12 = sVar3 & 0xfc00;
        if (uVar12 == 0xdc00) {
          this->m_index = lVar6 + 2;
          iVar17 = ((uint)(ushort)sVar2 * 0x400 + (uint)(ushort)sVar3) - (this->m_guide).zeroUcs;
          cVar15 = (char)iVar17 + '0';
          if (9 < iVar17 + 0xfca02400U) {
            cVar15 = '\0';
          }
        }
        if (uVar12 == 0xdc00) {
          return cVar15;
        }
      }
    }
LAB_00318c9a:
    cVar15 = '\0';
  }
  else {
    pQVar1 = &(this->m_guide).decimal;
    lVar10 = pQVar1->m_size;
    haystack_02.m_data = psVar7;
    haystack_02.m_size = lVar18;
    bVar11 = QtPrivate::startsWith(haystack_02,*pQVar1,CaseSensitive);
    if (bVar11) {
      this->m_index = lVar10 + lVar6;
      return '.';
    }
    if (NVar4 != DoubleScientificMode) goto LAB_00318e8f;
    pQVar1 = &(this->m_guide).exponent;
    lVar10 = pQVar1->m_size;
    haystack_03.m_data = psVar7;
    haystack_03.m_size = lVar18;
    bVar11 = QtPrivate::startsWith(haystack_03,*pQVar1,CaseInsensitive);
    if (!bVar11) goto LAB_00318e8f;
    this->m_index = lVar10 + lVar6;
LAB_0031906a:
    cVar15 = 'e';
  }
  return cVar15;
}

Assistant:

char NumericTokenizer::nextToken()
{
    // As long as caller stops iterating on a zero return, those don't need to
    // keep m_index correctly updated.
    Q_ASSERT(!done());
    // Mauls non-letters above 'Z' but we don't care:
    const auto asciiLower = [](unsigned char c) { return c >= 'A' ? c | 0x20 : c; };
    const QStringView tail = m_text.sliced(m_index);
    const QChar ch = tail.front();
    if (ch == u'\u2212') {
        // Special case: match the "proper" minus sign, for all locales.
        ++m_index;
        return '-';
    }
    if (m_guide.isC) {
        // "Conversion" to C locale is just a filter:
        ++m_index;
        if (Q_LIKELY(ch.unicode() < 256)) {
            unsigned char ascii = asciiLower(ch.toLatin1());
            if (Q_LIKELY(isAsciiDigit(ascii) || ('+' <= ascii && ascii <= lastMark)
                         // No caller presently (6.5) passes DoubleStandardMode,
                         // so !IntegerMode implies scientific, for now.
                         || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))
                         || (m_mode == QLocaleData::DoubleScientificMode && ascii == 'e'))) {
                return ascii;
            }
        }
        return 0;
    }
    if (ch.unicode() < 256) {
        // Accept the C locale's digits and signs in all locales:
        char ascii = asciiLower(ch.toLatin1());
        if (isAsciiDigit(ascii) || ascii == '-' || ascii == '+'
            // Also its Inf and NaN letters:
            || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))) {
            ++m_index;
            return ascii;
        }
    }

    // Other locales may be trickier:
    if (tail.startsWith(m_guide.minus)) {
        m_index += m_guide.minus.size();
        return '-';
    }
    if (tail.startsWith(m_guide.plus)) {
        m_index += m_guide.plus.size();
        return '+';
    }
    if (!m_guide.group.isEmpty() && tail.startsWith(m_guide.group)) {
        m_index += m_guide.group.size();
        // When group and decimal coincide, and a fractional part is not
        // unexpected, treat the last as a fractional part separator (and leave
        // the caller to special-case the situations where that causes a
        // parse-fail that we can dodge by not reading it that way).
        if (fractionGroupClash() && tail.indexOf(m_guide.decimal, m_guide.group.size()) == -1)
            return '.';
        return ',';
    }
    if (m_mode != QLocaleData::IntegerMode && tail.startsWith(m_guide.decimal)) {
        m_index += m_guide.decimal.size();
        return '.';
    }
    if (m_mode == QLocaleData::DoubleScientificMode
        && tail.startsWith(m_guide.exponent, Qt::CaseInsensitive)) {
        m_index += m_guide.exponent.size();
        return 'e';
    }

    // Must match qlocale_tools.h's unicodeForDigit()
    if (m_guide.zeroLen == 1) {
        if (!ch.isSurrogate()) {
            const uint gap = asBmpDigit(ch.unicode());
            if (gap < 10u) {
                ++m_index;
                return '0' + gap;
            }
        } else if (ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()) {
            return 0;
        }
    } else if (ch.isHighSurrogate()) {
        // None of the corner cases below matches a surrogate, so (update
        // already and) return early if we don't have a digit.
        if (tail.size() > 1) {
            QChar low = tail.at(1);
            if (low.isLowSurrogate()) {
                m_index += 2;
                const uint gap = QChar::surrogateToUcs4(ch, low) - m_guide.zeroUcs;
                return gap < 10u ? '0' + gap : 0;
            }
        }
        return 0;
    }

    // All cases where tail starts with properly-matched surrogate pair
    // have been handled by this point.
    Q_ASSERT(!(ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()));

    // Weird corner cases follow (code above assumes these match no surrogates).

    // Some locales use a non-breaking space (U+00A0) or its thin version
    // (U+202f) for grouping. These look like spaces, so people (and thus some
    // of our tests) use a regular space instead and complain if it doesn't
    // work.
    // Should this be extended generally to any case where group is a space ?
    if ((m_guide.group == u"\u00a0" || m_guide.group == u"\u202f") && tail.startsWith(u' ')) {
        ++m_index;
        return ',';
    }

    // Cyrillic has its own E, used by Ukrainian as exponent; but others
    // writing Cyrillic may well use that; and Ukrainians might well use E.
    // All other Cyrillic locales (officially) use plain ASCII E.
    if (m_guide.exponentCyrillic // Only true in scientific float mode.
        && (tail.startsWith(u"\u0415", Qt::CaseInsensitive)
            || tail.startsWith(u"E", Qt::CaseInsensitive))) {
        ++m_index;
        return 'e';
    }

    return 0;
}